

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

bool CoreML::Specification::operator==(RepeatedField<float> *a,RepeatedField<float> *b)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  float *pfVar4;
  int index;
  
  if (a->current_size_ != b->current_size_) {
    return false;
  }
  if (0 < a->current_size_) {
    index = 0;
    while( true ) {
      pfVar4 = google::protobuf::RepeatedField<float>::Get(a,index);
      fVar1 = *pfVar4;
      pfVar4 = google::protobuf::RepeatedField<float>::Get(b,index);
      fVar2 = *pfVar4;
      bVar3 = (bool)(-(fVar1 == fVar2) & 1);
      if (fVar1 != fVar2) {
        return bVar3;
      }
      if (NAN(fVar1) || NAN(fVar2)) break;
      index = index + 1;
      if (a->current_size_ <= index) {
        return bVar3;
      }
    }
    return bVar3;
  }
  return true;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}